

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

void __thiscall
leveldb::Version::GetOverlappingInputs
          (Version *this,int level,InternalKey *begin,InternalKey *end,
          vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *inputs)

{
  pointer ppFVar1;
  Comparator *pCVar2;
  int iVar3;
  size_t i;
  ulong uVar4;
  FileMetaData *f;
  Slice file_limit;
  Slice file_start;
  Slice local_78;
  Slice local_68;
  FileMetaData *local_58;
  Slice local_50;
  Slice local_40;
  
  if (level < 0) {
    __assert_fail("level >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                  ,0x1f5,
                  "void leveldb::Version::GetOverlappingInputs(int, const InternalKey *, const InternalKey *, std::vector<FileMetaData *> *)"
                 );
  }
  if (6 < (uint)level) {
    __assert_fail("level < config::kNumLevels",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                  ,0x1f6,
                  "void leveldb::Version::GetOverlappingInputs(int, const InternalKey *, const InternalKey *, std::vector<FileMetaData *> *)"
                 );
  }
  ppFVar1 = (inputs->
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((inputs->super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppFVar1) {
    (inputs->super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
    _M_impl.super__Vector_impl_data._M_finish = ppFVar1;
  }
  local_68 = (Slice)ZEXT816(0x14ba77);
  local_78 = (Slice)ZEXT816(0x14ba77);
  if (begin != (InternalKey *)0x0) {
    local_68 = InternalKey::user_key(begin);
  }
  if (end != (InternalKey *)0x0) {
    local_78 = InternalKey::user_key(end);
  }
  pCVar2 = (this->vset_->icmp_).user_comparator_;
  do {
    uVar4 = 0;
LAB_001161fc:
    do {
      ppFVar1 = this->files_[(uint)level].
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)this->files_[(uint)level].
                        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3) <= uVar4) {
        return;
      }
      local_58 = ppFVar1[uVar4];
      uVar4 = uVar4 + 1;
      local_40 = InternalKey::user_key(&local_58->smallest);
      local_50 = InternalKey::user_key(&local_58->largest);
      if (begin != (InternalKey *)0x0) {
        iVar3 = (*pCVar2->_vptr_Comparator[2])(pCVar2,&local_50,&local_68);
        if (iVar3 < 0) goto LAB_001161fc;
      }
      if (end != (InternalKey *)0x0) {
        iVar3 = (*pCVar2->_vptr_Comparator[2])(pCVar2,&local_40,&local_78);
        if (0 < iVar3) goto LAB_001161fc;
      }
      std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::push_back
                (inputs,&local_58);
      if (level != 0) goto LAB_001161fc;
      if (begin != (InternalKey *)0x0) {
        iVar3 = (*pCVar2->_vptr_Comparator[2])(pCVar2,&local_40,&local_68);
        if (iVar3 < 0) {
          local_68 = local_40;
          goto LAB_001162f9;
        }
      }
      if (end == (InternalKey *)0x0) goto LAB_001161fc;
      iVar3 = (*pCVar2->_vptr_Comparator[2])(pCVar2,&local_50,&local_78);
    } while (iVar3 < 1);
    local_78 = local_50;
LAB_001162f9:
    ppFVar1 = (inputs->
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>)
              ._M_impl.super__Vector_impl_data._M_start;
    if ((inputs->
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
        _M_impl.super__Vector_impl_data._M_finish != ppFVar1) {
      (inputs->super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
      )._M_impl.super__Vector_impl_data._M_finish = ppFVar1;
    }
  } while( true );
}

Assistant:

void Version::GetOverlappingInputs(int level, const InternalKey* begin,
                                   const InternalKey* end,
                                   std::vector<FileMetaData*>* inputs) {
  assert(level >= 0);
  assert(level < config::kNumLevels);
  inputs->clear();
  Slice user_begin, user_end;
  if (begin != nullptr) {
    user_begin = begin->user_key();
  }
  if (end != nullptr) {
    user_end = end->user_key();
  }
  const Comparator* user_cmp = vset_->icmp_.user_comparator();
  for (size_t i = 0; i < files_[level].size();) {
    FileMetaData* f = files_[level][i++];
    const Slice file_start = f->smallest.user_key();
    const Slice file_limit = f->largest.user_key();
    if (begin != nullptr && user_cmp->Compare(file_limit, user_begin) < 0) {
      // "f" is completely before specified range; skip it
    } else if (end != nullptr && user_cmp->Compare(file_start, user_end) > 0) {
      // "f" is completely after specified range; skip it
    } else {
      inputs->push_back(f);
      if (level == 0) {
        // Level-0 files may overlap each other.  So check if the newly
        // added file has expanded the range.  If so, restart search.
        if (begin != nullptr && user_cmp->Compare(file_start, user_begin) < 0) {
          user_begin = file_start;
          inputs->clear();
          i = 0;
        } else if (end != nullptr &&
                   user_cmp->Compare(file_limit, user_end) > 0) {
          user_end = file_limit;
          inputs->clear();
          i = 0;
        }
      }
    }
  }
}